

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

void __thiscall
boost::ext::ut::v1_1_8::
runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::~runner
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this)

{
  bool bVar1;
  pointer pp_Var2;
  pointer pbVar3;
  _func_void **suite;
  pointer pp_Var4;
  
  bVar1 = this->run_;
  if (bVar1 == false) {
    this->run_ = true;
    pp_Var2 = (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pp_Var4 = (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>.
                   _M_impl.super__Vector_impl_data._M_start; pp_Var4 != pp_Var2;
        pp_Var4 = pp_Var4 + 1) {
      (**pp_Var4)();
    }
    pp_Var4 = (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
        super__Vector_impl_data._M_finish != pp_Var4) {
      (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish = pp_Var4;
    }
  }
  if (this->dry_run_ == false) {
    reporter<boost::ext::ut::v1_1_8::printer>::on(&this->reporter_);
  }
  if ((bVar1 == false) && (this->fails_ != 0)) {
    exit(-1);
  }
  pbVar3 = (this->tag_).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar3 != (pointer)0x0) {
    operator_delete(pbVar3,(long)(this->tag_).
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar3);
  }
  pbVar3 = (this->filter_).path_.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar3 != (pointer)0x0) {
    operator_delete(pbVar3,(long)(this->filter_).path_.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar3);
  }
  pp_Var4 = (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pp_Var4 != (pointer)0x0) {
    operator_delete(pp_Var4,(long)(this->suites_).
                                  super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pp_Var4)
    ;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&(this->reporter_).printer_.out_);
  std::ios_base::~ios_base((ios_base *)&(this->reporter_).printer_.field_0xb0);
  return;
}

Assistant:

~runner() {
      const auto should_run = not run_;

      if (should_run) {
        static_cast<void>(run());
      }

      if (not dry_run_) {
        reporter_.on(events::summary{});
      }

      if (should_run and fails_) {
        std::exit(-1);
      }
    }